

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O2

void Sbd_ManCutReload(Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,int LevStop,Vec_Int_t *vCut,
                     Vec_Int_t *vCutTop,Vec_Int_t *vCutBot)

{
  int i;
  int iVar1;
  int i_00;
  Vec_Int_t *p;
  
  vCutTop->nSize = 0;
  vCutBot->nSize = 0;
  i_00 = 0;
  while( true ) {
    if (vCut->nSize <= i_00) {
      Vec_IntIsOrdered(vCut);
      return;
    }
    i = Vec_IntEntry(vCut,i_00);
    if (i == 0) {
      __assert_fail("Entry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                    ,0xe0,
                    "void Sbd_ManCutReload(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Vec_IntEntry(vMirrors,i);
    if (iVar1 != -1) {
      __assert_fail("Vec_IntEntry(vMirrors, Entry) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                    ,0xe1,
                    "void Sbd_ManCutReload(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Vec_IntEntry(vLutLevs,i);
    if (LevStop < iVar1) break;
    iVar1 = Vec_IntEntry(vLutLevs,i);
    p = vCutBot;
    if (iVar1 == LevStop) {
      p = vCutTop;
    }
    Vec_IntPush(p,i);
    i_00 = i_00 + 1;
  }
  __assert_fail("Vec_IntEntry(vLutLevs, Entry) <= LevStop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                ,0xe2,
                "void Sbd_ManCutReload(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

void Sbd_ManCutReload( Vec_Int_t * vMirrors, Vec_Int_t * vLutLevs, int LevStop, Vec_Int_t * vCut, Vec_Int_t * vCutTop, Vec_Int_t * vCutBot )
{
    int i, Entry;
    Vec_IntClear( vCutTop );
    Vec_IntClear( vCutBot );
    Vec_IntForEachEntry( vCut, Entry, i )
    {
        assert( Entry );
        assert( Vec_IntEntry(vMirrors, Entry) == -1 );
        assert( Vec_IntEntry(vLutLevs, Entry) <= LevStop );
        if ( Vec_IntEntry(vLutLevs, Entry) == LevStop )
            Vec_IntPush( vCutTop, Entry );
        else
            Vec_IntPush( vCutBot, Entry );
    }
    Vec_IntIsOrdered( vCut );
}